

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::BlendA64MaskTest8B_d16_ExtremeValues_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::BlendA64MaskTest8B_d16_ExtremeValues_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<libaom_test::FuncParam<void(*)(unsigned_char*,unsigned_int,unsigned_short_const*,unsigned_int,unsigned_short_const*,unsigned_int,unsigned_char_const*,unsigned_int,int,int,int,int,ConvolveParams*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x88068);
  anon_unknown.dwarf_17b8f50::BlendA64MaskTest8B_d16::BlendA64MaskTest8B_d16
            ((BlendA64MaskTest8B_d16 *)this_00);
  (((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
     *)&this_00->_vptr_Test)->
  super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*)>
  ).
  super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*)>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f47d68;
  this_00[1]._vptr_Test = (_func_int **)&PTR__BlendA64MaskTest8B_d16_ExtremeValues_Test_00f47db0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }